

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_util_test.c
# Opt level: O1

_Bool test_uo_temp_strcat(void)

{
  char *__dest;
  long lVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  char *pcVar4;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  __dest = (char *)(lVar1 + -0x1000);
  *(undefined4 *)(in_FS_OFFSET + -0x1ff) = 0x6d7573;
  pcVar4 = "lorem ip";
  if (__dest != "lorem ip") {
    in_FS_OFFSET[-0x200] = 0x7069206d65726f6c;
    pcVar4 = __dest;
  }
  iVar2 = strcmp("lorem ipsum",pcVar4);
  *(undefined1 *)((long)in_FS_OFFSET + -0xff5) = 0;
  *(undefined2 *)(lVar1 + -0xff8) = 0x7573;
  *(undefined1 *)(lVar1 + -0xff6) = 0x6d;
  pcVar4 = "lorem ip";
  if (__dest != "lorem ip") {
    in_FS_OFFSET[-0x200] = 0x7069206d65726f6c;
    pcVar4 = __dest;
  }
  __n = strlen(pcVar4);
  if (__n + 5 < 0x1000) {
    *(undefined1 *)((long)in_FS_OFFSET + (__n - 0xffb)) = 0;
    *(undefined1 *)(lVar1 + -0xffc + __n) = 0x66;
    builtin_strncpy(__dest + __n," asd",4);
    if (__dest != pcVar4) {
      memcpy(__dest,pcVar4,__n);
    }
    iVar3 = strcmp("lorem ipsum asdf",pcVar4);
    return iVar3 == 0 && iVar2 == 0;
  }
  __assert_fail("len < UO_TEMPSTR_LEN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_util/src/include/uo_util/uo_util.h"
                ,0x4b,"char *uo_temp_strcat(const char *, const char *)");
}

Assistant:

bool test_uo_temp_strcat(void)
{
    bool passed = true;

    passed &= strcmp("lorem ipsum", uo_temp_strcat("lorem ip", "sum")) == 0;

    char *temp = uo_temp_strcat("lorem ip", "sum");
    uo_temp_strcat(temp, " asdf");
    passed &= strcmp("lorem ipsum asdf", temp) == 0;

    return passed;
}